

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall Tokenizer::parseName(Token *__return_storage_ptr__,Tokenizer *this,char c)

{
  _Storage<char,_true> __rhs;
  bool bVar1;
  _Optional_payload_base<char> _Var2;
  optional<char> oVar3;
  int iVar4;
  const_iterator cVar5;
  TokenizerException *this_00;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  *this_01;
  long lVar6;
  allocator<char> local_312;
  undefined1 local_311;
  undefined1 local_310;
  undefined1 local_30f;
  allocator<char> local_30e;
  allocator<char> local_30d;
  allocator<char> local_30c;
  allocator<char> local_30b;
  allocator<char> local_30a;
  allocator<char> local_309;
  string res;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defaultMethods;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_190;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_168;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_140;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_118;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_f0;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_c8;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_a0;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_78;
  undefined1 auStack_58 [8];
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_50;
  
  _Var2._M_engaged = false;
  _Var2._M_payload._M_value = c;
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
LAB_001074b7:
  __rhs = _Var2._M_payload;
  if (((byte)(__rhs._M_value + 0x9fU) < 0x1a) ||
     (__rhs._M_value == '_' || (byte)(__rhs._M_value + 0xbfU) < 0x1a)) goto LAB_001074d4;
  this->col_number = this->col_number + -1;
  this->pos = this->pos + -1;
  if (res._M_string_length == 0) {
    this_00 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"Unexpected character \'",&local_312);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &defaultMethods,&local_2b0,__rhs._M_value);
    std::operator+(&local_290,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &defaultMethods,"\'");
    TokenizerException::TokenizerException
              (this_00,&local_290,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(this_00,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(&res,"true");
  if (bVar1) {
    this_01 = (_Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
               *)(auStack_58 + 8);
    local_50._M_first._M_storage._0_1_ = 1;
LAB_0010756c:
    *(undefined1 *)(this_01 + 1) = 3;
    __return_storage_ptr__->type = Boolean;
    goto LAB_0010757e;
  }
  bVar1 = std::operator==(&res,"false");
  if (bVar1) {
    this_01 = &local_78;
    local_78._M_first._M_storage._0_1_ = 0;
    goto LAB_0010756c;
  }
  iVar4 = std::__cxx11::string::compare((ulong)&res,0,(char *)0x2);
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"GET",(allocator<char> *)&local_2b0);
    std::__cxx11::string::string<std::allocator<char>>(local_270,"POST",&local_312);
    std::__cxx11::string::string<std::allocator<char>>(local_250,"PUT",&local_309);
    std::__cxx11::string::string<std::allocator<char>>(local_230,"HEAD",&local_30a);
    std::__cxx11::string::string<std::allocator<char>>(local_210,"OPTIONS",&local_30b);
    std::__cxx11::string::string<std::allocator<char>>(local_1f0,"DELETE",&local_30c);
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"TRACE",&local_30d);
    std::__cxx11::string::string<std::allocator<char>>(local_1b0,"CONNECT",&local_30e);
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&defaultMethods,&local_290,&local_190,0,&local_30f,&local_310,&local_311);
    lVar6 = 0xe0;
    do {
      std::__cxx11::string::~string((string *)((long)&local_290._M_dataplus._M_p + lVar6));
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x20);
    cVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&defaultMethods._M_h,&res);
    if (cVar5.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>::
      _Variant_storage<2ul,std::__cxx11::string&>
                ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)&local_f0,&res
                );
      __return_storage_ptr__->type = Method;
      std::__detail::__variant::
      _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&__return_storage_ptr__->value,
                        (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&local_f0);
      std::__detail::__variant::
      _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::~_Variant_storage(&local_f0);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&defaultMethods._M_h);
      goto LAB_0010758e;
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&defaultMethods._M_h);
    iVar4 = this->pos;
    if ((ulong)(long)iVar4 < (this->program)._M_string_length) {
      oVar3 = peek(this,1);
      if (((ushort)oVar3.super__Optional_base<char,_true,_true>._M_payload.
                   super__Optional_payload_base<char> >> 8 & 1) == 0) {
        std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>
        ::_Variant_storage<2ul,std::__cxx11::string&>
                  ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)&local_140,
                   &res);
        __return_storage_ptr__->type = Name;
        this_01 = &local_140;
      }
      else if (oVar3.super__Optional_base<char,_true,_true>._M_payload.
               super__Optional_payload_base<char>._M_payload == '[' &&
               (this->program)._M_dataplus._M_p[iVar4] == '[') {
        next(this,2);
        this->parsingHeaderBlock = true;
        std::__cxx11::string::_M_assign((string *)&this->header_block_name);
        std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>
        ::_Variant_storage<2ul,std::__cxx11::string&>
                  ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)&local_168,
                   &res);
        __return_storage_ptr__->type = HeaderOpener;
        this_01 = &local_168;
      }
      else {
        std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>
        ::_Variant_storage<2ul,std::__cxx11::string&>
                  ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)&local_190,
                   &res);
        __return_storage_ptr__->type = Name;
        this_01 = &local_190;
      }
    }
    else {
      std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>::
      _Variant_storage<2ul,std::__cxx11::string&>
                ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)&local_118,
                 &res);
      __return_storage_ptr__->type = Name;
      this_01 = &local_118;
    }
    goto LAB_0010757e;
  }
  std::__cxx11::string::substr((ulong)&local_290,(ulong)&res);
  std::variant<int,double,std::__cxx11::string,bool,char>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<int,double,std::__cxx11::string,bool,char> *)&local_a0,&local_290);
  __return_storage_ptr__->type = Method;
  std::__detail::__variant::
  _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&__return_storage_ptr__->value,
                    (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&local_a0);
  std::__detail::__variant::
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::~_Variant_storage(&local_a0);
  std::__cxx11::string::~string((string *)&local_290);
  goto LAB_0010758e;
LAB_001074d4:
  std::__cxx11::string::push_back((char)&res);
  _Var2 = (_Optional_payload_base<char>)next(this);
  if (((ushort)_Var2 >> 8 & 1) == 0) {
    std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>::
    _Variant_storage<2ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)&local_c8,&res);
    __return_storage_ptr__->type = Name;
    this_01 = &local_c8;
LAB_0010757e:
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&__return_storage_ptr__->value,
                      (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&this_01->_M_first);
    std::__detail::__variant::
    _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&this_01->_M_first);
LAB_0010758e:
    std::__cxx11::string::~string((string *)&res);
    return __return_storage_ptr__;
  }
  goto LAB_001074b7;
}

Assistant:

Token Tokenizer::parseName(char c) {
    optional<char> _;
    string res;
    // while it's a valid name char
    while ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z') || c == '_') {
        res += c;
        _ = next();
        if (!_.has_value()) {
            return Token(Name, res);
        }
        c = _.value();
    }
    unnext();

    if (res.length() == 0) {
        throw TokenizerException(string("Unexpected character '") + c + "'", line_number, col_number, current_line);
    }

    if (res == "true")
        return Token(Boolean, true);
    else if (res == "false")
        return Token(Boolean, false);
    else {
        // Http Method parsing
        if (res.compare(0, 2, "M_") == 0) {
            return Token(Method, res.substr(2));
        }
        const unordered_set<string> defaultMethods =
                {"GET", "POST", "PUT", "HEAD", "OPTIONS", "DELETE", "TRACE", "CONNECT"};
        auto it = defaultMethods.find(res);
        if (it != defaultMethods.end()) {
            return Token(Method, res);
        }
    }

    _ = peek();
    if (!_.has_value()) {
        return Token(Name, res);
    }
    optional<char> _1 = peek(1);
    if (!_1.has_value()) {
        return Token(Name, res);
    }

    if (_.value() == '[' && _1.value() == '[') {
        next(2);
        parsingHeaderBlock = true;
        header_block_name = res;
        return Token(HeaderOpener, res);
    }
    return Token(Name, res);
}